

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

void ExtensionObject_deleteMembers(UA_ExtensionObject *p,UA_DataType *_)

{
  UA_DataType *__local;
  UA_ExtensionObject *p_local;
  
  if (p->encoding < UA_EXTENSIONOBJECT_DECODED) {
    NodeId_deleteMembers(&(p->content).encoded.typeId,(UA_DataType *)0x0);
    String_deleteMembers(&(p->content).encoded.body,(UA_DataType *)0x0);
  }
  else if ((p->encoding == UA_EXTENSIONOBJECT_DECODED) && ((p->content).decoded.data != (void *)0x0)
          ) {
    UA_delete((p->content).decoded.data,(p->content).decoded.type);
  }
  return;
}

Assistant:

static void
ExtensionObject_deleteMembers(UA_ExtensionObject *p, const UA_DataType *_) {
    switch(p->encoding) {
    case UA_EXTENSIONOBJECT_ENCODED_NOBODY:
    case UA_EXTENSIONOBJECT_ENCODED_BYTESTRING:
    case UA_EXTENSIONOBJECT_ENCODED_XML:
        NodeId_deleteMembers(&p->content.encoded.typeId, NULL);
        String_deleteMembers(&p->content.encoded.body, NULL);
        break;
    case UA_EXTENSIONOBJECT_DECODED:
        if(p->content.decoded.data)
            UA_delete(p->content.decoded.data, p->content.decoded.type);
        break;
    default:
        break;
    }
}